

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlEntityPtr xmlSAX2GetParameterEntity(void *ctx,xmlChar *name)

{
  xmlEntityPtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = xmlGetParameterEntity(*(xmlDocPtr *)((long)ctx + 0x10),name);
  }
  return (xmlEntityPtr)ctx_local;
}

Assistant:

xmlEntityPtr
xmlSAX2GetParameterEntity(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlEntityPtr ret;

    if (ctx == NULL) return(NULL);
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2GetParameterEntity(%s)\n", name);
#endif

    ret = xmlGetParameterEntity(ctxt->myDoc, name);
    return(ret);
}